

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  size_t *psVar1;
  int iVar2;
  char local_9;
  
  (this->position).chars_read_total = (this->position).chars_read_total + 1;
  (this->position).chars_read_current_line = (this->position).chars_read_current_line + 1;
  if (this->next_unget == true) {
    this->next_unget = false;
    iVar2 = this->current;
  }
  else {
    iVar2 = (**((this->ia).
                super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_input_adapter_protocol)();
    this->current = iVar2;
  }
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    local_9 = (char)iVar2;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
    iVar2 = this->current;
    if (iVar2 == 10) {
      psVar1 = &(this->position).lines_read;
      *psVar1 = *psVar1 + 1;
      (this->position).chars_read_current_line = 0;
      iVar2 = 10;
    }
  }
  return iVar2;
}

Assistant:

std::char_traits<char>::int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia->get_character();
        }

        if (JSON_LIKELY(current != std::char_traits<char>::eof()))
        {
            token_string.push_back(std::char_traits<char>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }